

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O3

void __thiscall ExecutorRegVm::~ExecutorRegVm(ExecutorRegVm *this)

{
  (*(code *)NULLC::dealloc)(this->execErrorBuffer);
  (*(code *)NULLC::dealloc)(this->tempStackArrayBase);
  (*(code *)NULLC::dealloc)(this->regFileArrayBase);
  if ((this->breakCode).data != (RegVmCmd *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->callStack).data != (RegVmCmd **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  FastVector<char,_true,_true>::~FastVector(&this->dataStack);
  return;
}

Assistant:

ExecutorRegVm::~ExecutorRegVm()
{
	NULLC::dealloc(execErrorBuffer);

	NULLC::dealloc(tempStackArrayBase);

	NULLC::dealloc(regFileArrayBase);

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(dcCallVM)
		dcFree(dcCallVM);
#endif
}